

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

bool __thiscall gmlc::networking::TcpServer::start(TcpServer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer psVar2;
  pointer psVar3;
  TcpAcceptor *this_00;
  bool bVar4;
  int iVar5;
  int *piVar6;
  pointer psVar7;
  iterator __begin3;
  pointer psVar8;
  bool local_6c;
  string local_68;
  SocketFactory *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((((this->halted)._M_base._M_i & 1U) != 0) &&
     (bVar4 = reConnect(this,(milliseconds)0x3e8), !bVar4)) {
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"reconnect failed","");
    logger(this,0,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
    ::clear(&this->acceptors);
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 200000000;
    do {
      iVar5 = nanosleep((timespec *)&local_68,(timespec *)&local_68);
      if (iVar5 != -1) break;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    LOCK();
    (this->halted)._M_base._M_i = false;
    UNLOCK();
    initialConnect(this);
    if ((((this->halted)._M_base._M_i & 1U) != 0) &&
       (bVar4 = reConnect(this,(milliseconds)0x3e8), !bVar4)) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"reconnect part 2 failed","");
      logger(this,0,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->accepting);
  if (iVar5 == 0) {
    psVar2 = (this->connections).
             super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar8 = (this->connections).
                  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar2; psVar8 = psVar8 + 1)
    {
      if (((((psVar8->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->receivingHalt).activated._M_base._M_i & 1U) == 0) {
        TcpConnection::startReceive
                  ((psVar8->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->accepting);
    psVar7 = (this->acceptors).
             super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->acceptors).
             super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar7 == psVar3) {
      local_6c = true;
    }
    else {
      local_48 = &this->socket_factory;
      local_6c = true;
      do {
        this_00 = (psVar7->
                  super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        TcpConnection::create
                  ((TcpConnection *)&stack0xffffffffffffffc0,local_48,this->ioctx,this->bufferSize);
        bVar4 = TcpAcceptor::start(this_00,(pointer *)&stack0xffffffffffffffc0);
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        if (!bVar4) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"acceptor has failed to start","");
          logger(this,0,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          local_6c = false;
        }
        psVar7 = psVar7 + 1;
      } while (psVar7 != psVar3);
    }
    return local_6c;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

bool TcpServer::start()
{
    if (halted.load(std::memory_order_acquire)) {
        if (!reConnect(std::chrono::milliseconds(1000))) {
            logger(0, "reconnect failed");
            acceptors.clear();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));
            halted.store(false);
            initialConnect();
            if (halted) {
                if (!reConnect(std::chrono::milliseconds(1000))) {
                    logger(0, "reconnect part 2 failed");
                    return false;
                }
            }
        }
    }

    {  // scope for the lock_guard
        std::lock_guard<std::mutex> lock(accepting);
        if (!connections.empty()) {
            for (auto& conn : connections) {
                if (!conn->isReceiving()) {
                    conn->startReceive();
                }
            }
        }
    }
    bool success = true;
    for (auto& acc : acceptors) {
        if (!acc->start(
                TcpConnection::create(socket_factory, ioctx, bufferSize))) {
            logger(0, "acceptor has failed to start");
            success = false;
        }
    }
    return success;
}